

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_access_chain
          (CompilerMSL *this,uint32_t *ops,uint32_t length)

{
  uint32_t *puVar1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar2;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  Variant *pVVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  string *psVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  BuiltIn BVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  undefined3 uVar23;
  size_t sVar24;
  bool bVar25;
  bool bVar26;
  ExecutionModel EVar27;
  ExecutionModel EVar28;
  uint32_t uVar29;
  uint uVar30;
  SPIRVariable *pSVar31;
  SPIRType *pSVar32;
  SPIRConstant *pSVar33;
  ulong uVar34;
  SPIRExpression *pSVar35;
  Meta *pMVar36;
  SPIREntryPoint *pSVar37;
  mapped_type *pmVar38;
  mapped_type *pmVar39;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  undefined4 in_register_00000014;
  uint *insert_begin;
  ID id;
  uint *itr;
  uint uVar40;
  __hashtable *__h;
  TypeID *pTVar41;
  byte bVar42;
  ulong uVar43;
  uint32_t index;
  AccessChainMeta meta;
  string e;
  __node_gen_type __node_gen;
  SmallVector<unsigned_int,_8UL> indices;
  uint32_t local_12c;
  byte local_125;
  uint local_124;
  AccessChainMeta local_120;
  uint32_t local_114;
  SPIRType *local_110;
  ulong local_108;
  ulong local_100;
  SPIRVariable *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  uint32_t local_d0;
  uint32_t local_cc;
  string local_c8;
  SmallVector<unsigned_int,_8UL> local_a8;
  string local_70;
  string local_50;
  
  local_108 = CONCAT44(in_register_00000014,length);
  pSVar31 = Compiler::maybe_get_backing_variable((Compiler *)this,ops[2]);
  EVar27 = Compiler::get_execution_model((Compiler *)this);
  local_125 = (this->msl_options).multi_patch_workgroup;
  if (pSVar31 == (SPIRVariable *)0x0) {
    local_124 = 0;
    bVar25 = true;
    bVar26 = false;
  }
  else {
    bVar25 = Compiler::has_decoration((Compiler *)this,(ID)ops[2],DecorationPatch);
    bVar26 = true;
    if (!bVar25) {
      pSVar32 = Compiler::get_variable_data_type((Compiler *)this,pSVar31);
      bVar26 = is_patch_block(this,pSVar32);
    }
    if (pSVar31->storage == StorageClassInput) {
      bVar25 = false;
    }
    else if (pSVar31->storage == StorageClassOutput) {
      EVar28 = Compiler::get_execution_model((Compiler *)this);
      bVar25 = EVar28 != ExecutionModelTessellationControl;
    }
    else {
      bVar25 = true;
    }
    uVar29 = (pSVar31->super_IVariant).self.id;
    local_124 = CONCAT31((int3)(uVar29 >> 8),uVar29 != ops[2]);
  }
  uVar29 = Compiler::get_decoration((Compiler *)this,(ID)ops[2],DecorationBuiltIn);
  if (((bVar25) || (pSVar31 == (SPIRVariable *)0x0)) || (bVar26 != false)) {
LAB_00265422:
    if (pSVar31 == (SPIRVariable *)0x0) {
      id.id = 0;
    }
    else {
      id.id = (pSVar31->super_IVariant).self.id;
    }
    pMVar36 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,id);
    EVar27 = Compiler::get_execution_model((Compiler *)this);
    if (pSVar31 == (SPIRVariable *)0x0) {
      return false;
    }
    if (pMVar36 == (Meta *)0x0) {
      return false;
    }
    if (EVar27 == ExecutionModelTessellationControl) {
      if (((pMVar36->decoration).builtin_type != BuiltInTessLevelInner) ||
         (pSVar37 = Compiler::get_entry_point((Compiler *)this),
         ((pSVar37->flags).lower & 0x400000) == 0)) {
        return false;
      }
      uVar43 = (ulong)ops[3];
      if ((uVar43 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar43].type == TypeConstant))
      {
        pSVar33 = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + uVar43);
      }
      else {
        pSVar33 = (SPIRConstant *)0x0;
      }
      if ((pSVar33 != (SPIRConstant *)0x0) && ((pSVar33->m).c[0].r[0].u32 == 1)) {
        return false;
      }
      pSVar31 = Compiler::set<spirv_cross::SPIRVariable,spirv_cross::SPIRVariable&>
                          ((Compiler *)this,ops[1],pSVar31);
      *(uint32_t *)&(pSVar31->super_IVariant).field_0xc = *ops;
      this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
      local_a8.super_VectorView<unsigned_int>.ptr =
           (uint *)CONCAT44(local_a8.super_VectorView<unsigned_int>.ptr._4_4_,ops[2]);
      pmVar38 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,(key_type *)&local_a8);
      local_f0._M_dataplus._M_p._0_4_ = ops[1];
      pmVar39 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,(key_type *)&local_f0);
      ::std::__cxx11::string::_M_assign((string *)pmVar39);
      ::std::__cxx11::string::_M_assign((string *)&(pmVar39->decoration).qualified_alias);
      ::std::__cxx11::string::_M_assign((string *)&(pmVar39->decoration).hlsl_semantic);
      (pmVar39->decoration).decoration_flags.lower = (pmVar38->decoration).decoration_flags.lower;
      if (pmVar38 == pmVar39) {
        BVar19 = (pmVar38->decoration).builtin_type;
        uVar20 = (pmVar38->decoration).location;
        uVar21 = (pmVar38->decoration).component;
        uVar22 = (pmVar38->decoration).set;
        uVar15 = (pmVar38->decoration).binding;
        uVar16 = (pmVar38->decoration).offset;
        uVar17 = (pmVar38->decoration).xfb_buffer;
        uVar18 = (pmVar38->decoration).xfb_stride;
        uVar29 = (pmVar38->decoration).stream;
        uVar12 = (pmVar38->decoration).array_stride;
        uVar13 = (pmVar38->decoration).matrix_stride;
        uVar14 = (pmVar38->decoration).input_attachment;
        uVar4 = *(undefined8 *)((long)&(pmVar38->decoration).index + 1);
        *(undefined8 *)((long)&(pmVar39->decoration).input_attachment + 1) =
             *(undefined8 *)((long)&(pmVar38->decoration).input_attachment + 1);
        *(undefined8 *)((long)&(pmVar39->decoration).index + 1) = uVar4;
        (pmVar39->decoration).stream = uVar29;
        (pmVar39->decoration).array_stride = uVar12;
        (pmVar39->decoration).matrix_stride = uVar13;
        (pmVar39->decoration).input_attachment = uVar14;
        (pmVar39->decoration).binding = uVar15;
        (pmVar39->decoration).offset = uVar16;
        (pmVar39->decoration).xfb_buffer = uVar17;
        (pmVar39->decoration).xfb_stride = uVar18;
        (pmVar39->decoration).builtin_type = BVar19;
        (pmVar39->decoration).location = uVar20;
        (pmVar39->decoration).component = uVar21;
        (pmVar39->decoration).set = uVar22;
        (pmVar39->decoration).extended.flags.lower = (pmVar38->decoration).extended.flags.lower;
      }
      else {
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&(pmVar39->decoration).decoration_flags.higher,
                   &(pmVar38->decoration).decoration_flags.higher._M_h);
        BVar19 = (pmVar38->decoration).builtin_type;
        uVar20 = (pmVar38->decoration).location;
        uVar21 = (pmVar38->decoration).component;
        uVar22 = (pmVar38->decoration).set;
        uVar15 = (pmVar38->decoration).binding;
        uVar16 = (pmVar38->decoration).offset;
        uVar17 = (pmVar38->decoration).xfb_buffer;
        uVar18 = (pmVar38->decoration).xfb_stride;
        uVar29 = (pmVar38->decoration).stream;
        uVar12 = (pmVar38->decoration).array_stride;
        uVar13 = (pmVar38->decoration).matrix_stride;
        uVar14 = (pmVar38->decoration).input_attachment;
        uVar4 = *(undefined8 *)((long)&(pmVar38->decoration).index + 1);
        *(undefined8 *)((long)&(pmVar39->decoration).input_attachment + 1) =
             *(undefined8 *)((long)&(pmVar38->decoration).input_attachment + 1);
        *(undefined8 *)((long)&(pmVar39->decoration).index + 1) = uVar4;
        (pmVar39->decoration).stream = uVar29;
        (pmVar39->decoration).array_stride = uVar12;
        (pmVar39->decoration).matrix_stride = uVar13;
        (pmVar39->decoration).input_attachment = uVar14;
        (pmVar39->decoration).binding = uVar15;
        (pmVar39->decoration).offset = uVar16;
        (pmVar39->decoration).xfb_buffer = uVar17;
        (pmVar39->decoration).xfb_stride = uVar18;
        (pmVar39->decoration).builtin_type = BVar19;
        (pmVar39->decoration).location = uVar20;
        (pmVar39->decoration).component = uVar21;
        (pmVar39->decoration).set = uVar22;
        (pmVar39->decoration).extended.flags.lower = (pmVar38->decoration).extended.flags.lower;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&(pmVar39->decoration).extended.flags.higher,
                   &(pmVar38->decoration).extended.flags.higher._M_h);
      }
      uVar4 = *(undefined8 *)(pmVar38->decoration).extended.values;
      uVar5 = *(undefined8 *)((pmVar38->decoration).extended.values + 2);
      uVar6 = *(undefined8 *)((pmVar38->decoration).extended.values + 4);
      uVar7 = *(undefined8 *)((pmVar38->decoration).extended.values + 6);
      uVar8 = *(undefined8 *)((pmVar38->decoration).extended.values + 8);
      uVar9 = *(undefined8 *)((pmVar38->decoration).extended.values + 10);
      uVar10 = *(undefined8 *)((pmVar38->decoration).extended.values + 0xd);
      *(undefined8 *)((pmVar39->decoration).extended.values + 0xb) =
           *(undefined8 *)((pmVar38->decoration).extended.values + 0xb);
      *(undefined8 *)((pmVar39->decoration).extended.values + 0xd) = uVar10;
      *(undefined8 *)((pmVar39->decoration).extended.values + 8) = uVar8;
      *(undefined8 *)((pmVar39->decoration).extended.values + 10) = uVar9;
      *(undefined8 *)((pmVar39->decoration).extended.values + 4) = uVar6;
      *(undefined8 *)((pmVar39->decoration).extended.values + 6) = uVar7;
      *(undefined8 *)(pmVar39->decoration).extended.values = uVar4;
      *(undefined8 *)((pmVar39->decoration).extended.values + 2) = uVar5;
      SmallVector<spirv_cross::Meta::Decoration,_0UL>::operator=
                (&pmVar39->members,&pmVar38->members);
      if (pmVar38 != pmVar39) {
        ::std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&pmVar39->decoration_word_offset,&(pmVar38->decoration_word_offset)._M_h);
      }
      uVar23 = *(undefined3 *)&pmVar38->field_0x1b9;
      uVar29 = pmVar38->hlsl_magic_counter_buffer;
      pmVar39->hlsl_is_magic_counter_buffer = pmVar38->hlsl_is_magic_counter_buffer;
      *(undefined3 *)&pmVar39->field_0x1b9 = uVar23;
      pmVar39->hlsl_magic_counter_buffer = uVar29;
      Compiler::inherit_expression_dependencies((Compiler *)this,ops[1],ops[2]);
      return true;
    }
    return false;
  }
  bVar25 = Compiler::is_builtin_variable((Compiler *)this,pSVar31);
  if ((bVar25) && ((4 < uVar29 || (uVar29 == 2)))) {
    pSVar32 = Compiler::get_variable_data_type((Compiler *)this,pSVar31);
    if (*(int *)&(pSVar32->super_IVariant).field_0xc != 0xf) goto LAB_00265422;
  }
  local_120.storage_physical_type = 0;
  local_120.need_transpose = false;
  local_120.storage_is_packed = false;
  local_120.storage_is_invariant = false;
  local_120.flattened_struct = false;
  local_a8.super_VectorView<unsigned_int>.ptr = (uint *)&local_a8.stack_storage;
  local_a8.super_VectorView<unsigned_int>.buffer_size = 0;
  local_a8.buffer_capacity = 8;
  uVar29 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
  SmallVector<unsigned_int,_8UL>::reserve(&local_a8,(ulong)((int)local_108 - 2));
  local_114 = this->next_metal_resource_ids[(ulong)(pSVar31->storage != StorageClassInput) + 0xc];
  local_cc = local_114;
  if ((char)local_124 == '\0') {
    SmallVector<unsigned_int,_8UL>::reserve
              (&local_a8,local_a8.super_VectorView<unsigned_int>.buffer_size + 1);
    *(uint32_t *)
     ((long)&((_Alloc_hider *)local_a8.super_VectorView<unsigned_int>.ptr)->_M_p +
     local_a8.super_VectorView<unsigned_int>.buffer_size * 4) = ops[3];
    local_a8.super_VectorView<unsigned_int>.buffer_size =
         local_a8.super_VectorView<unsigned_int>.buffer_size + 1;
  }
  else {
    local_114 = ops[2];
  }
  local_110 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + *ops);
  local_12c = Compiler::get_extended_decoration
                        ((Compiler *)this,(pSVar31->super_IVariant).self.id,
                         SPIRVCrossDecorationInterfaceMemberIndex);
  local_100 = local_108 & 0xffffffff;
  local_f8 = pSVar31;
  if (pSVar31->storage == StorageClassInput) {
LAB_00264d2b:
    local_d0 = uVar29;
    pSVar32 = Compiler::get_variable_element_type((Compiler *)this,pSVar31);
    uVar30 = local_124 & 0xff;
    uVar40 = -uVar30 + 4;
    uVar43 = (ulong)uVar40;
    if ((local_12c == 0xffffffff) && (uVar40 < (uint)local_108)) {
      uVar29 = (local_f8->super_IVariant).self.id;
      pSVar33 = Compiler::get_constant((Compiler *)this,(ConstantID)ops[uVar40]);
      local_12c = Compiler::get_extended_member_decoration
                            ((Compiler *)this,uVar29,(pSVar33->m).c[0].r[0].u32,
                             SPIRVCrossDecorationInterfaceMemberIndex);
      if (local_12c == 0xffffffff) {
        __assert_fail("index != uint32_t(-1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x17b2,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                     );
      }
      pSVar33 = Compiler::get_constant((Compiler *)this,(ConstantID)ops[uVar40]);
      pSVar32 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           (pSVar32->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                           [(pSVar33->m).c[0].r[0].u32].id);
      uVar43 = (ulong)(-uVar30 + 5);
    }
    bVar42 = EVar27 == ExecutionModelTessellationControl & local_125;
    bVar25 = (uint)uVar43 < (uint)local_108;
    uVar34 = uVar43;
    if (bVar25) {
      do {
        if (((bVar42 != 0) ||
            ((bVar26 = Compiler::is_array((Compiler *)this,pSVar32), !bVar26 &&
             (bVar26 = Compiler::is_matrix((Compiler *)this,pSVar32), !bVar26)))) &&
           (uVar34 = uVar43, *(int *)&(pSVar32->super_IVariant).field_0xc != 0xf)) break;
        uVar34 = (ulong)ops[uVar43];
        if ((uVar34 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.buffer_size) &&
           (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar34].type == TypeConstant
           )) {
          pSVar33 = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + uVar34);
        }
        else {
          pSVar33 = (SPIRConstant *)0x0;
        }
        if ((pSVar33 == (SPIRConstant *)0x0) || (pSVar33->specialization == true)) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,
                     "Trying to dynamically index into an array interface variable in tessellation. This is currently unsupported."
                     ,"");
          ::std::runtime_error::runtime_error(this_01,(string *)&local_f0);
          *(undefined ***)this_01 = &PTR__runtime_error_0035b0b8;
          __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar30 = (pSVar33->m).c[0].r[0].u32;
        local_12c = local_12c + uVar30;
        uVar40 = (pSVar32->parent_type).id;
        if (uVar40 == 0) {
          if (*(int *)&(pSVar32->super_IVariant).field_0xc == 0xf) {
            uVar40 = (pSVar32->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar30].id;
            goto LAB_00264e6b;
          }
        }
        else {
LAB_00264e6b:
          pSVar32 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + uVar40);
        }
        uVar43 = uVar43 + 1;
        bVar25 = uVar43 < local_100;
        uVar34 = local_100;
      } while (uVar43 != local_100);
    }
    if (bVar42 == 0) {
      bVar26 = Compiler::is_matrix((Compiler *)this,local_110);
      if ((!bVar26) &&
         (bVar26 = Compiler::is_array((Compiler *)this,local_110),
         !bVar26 && *(int *)&(local_110->super_IVariant).field_0xc != 0xf)) goto LAB_00264ef2;
    }
    else if (*(int *)&(local_110->super_IVariant).field_0xc != 0xf) {
LAB_00264ef2:
      local_f0._M_dataplus._M_p._0_4_ = get_uint_type_id(this);
      uVar29 = local_d0;
      local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffffffffff00;
      Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
                ((Compiler *)this,local_d0,(uint *)&local_f0,&local_12c,(bool *)&local_c8);
      SmallVector<unsigned_int,_8UL>::reserve
                (&local_a8,local_a8.super_VectorView<unsigned_int>.buffer_size + 1);
      *(uint32_t *)
       ((long)&((_Alloc_hider *)local_a8.super_VectorView<unsigned_int>.ptr)->_M_p +
       local_a8.super_VectorView<unsigned_int>.buffer_size * 4) = uVar29;
      sVar24 = local_a8.super_VectorView<unsigned_int>.buffer_size + 1;
      if (bVar25) {
        itr = (uint *)((long)&((_Alloc_hider *)local_a8.super_VectorView<unsigned_int>.ptr)->_M_p +
                      local_a8.super_VectorView<unsigned_int>.buffer_size * 4 + 4);
        insert_begin = ops + (uVar34 & 0xffffffff);
        local_a8.super_VectorView<unsigned_int>.buffer_size =
             local_a8.super_VectorView<unsigned_int>.buffer_size + 1;
        goto LAB_00264fe8;
      }
      goto LAB_00264fed;
    }
    Compiler::set_extended_decoration
              ((Compiler *)this,ops[1],SPIRVCrossDecorationInterfaceMemberIndex,local_12c);
    sVar24 = local_a8.super_VectorView<unsigned_int>.buffer_size;
  }
  else {
    pSVar32 = Compiler::get_variable_element_type((Compiler *)this,pSVar31);
    bVar25 = Compiler::has_decoration
                       ((Compiler *)this,(ID)(pSVar32->super_IVariant).self.id,DecorationBlock);
    if (bVar25) goto LAB_00264d2b;
    if (local_12c == 0xffffffff) {
      __assert_fail("index != uint32_t(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x17e3,
                    "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                   );
    }
    local_f0._M_dataplus._M_p._0_4_ = get_uint_type_id(this);
    local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffffffffff00;
    Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
              ((Compiler *)this,uVar29,(uint *)&local_f0,&local_12c,(bool *)&local_c8);
    SmallVector<unsigned_int,_8UL>::reserve
              (&local_a8,local_a8.super_VectorView<unsigned_int>.buffer_size + 1);
    puVar1 = (uint32_t *)
             ((long)&((_Alloc_hider *)local_a8.super_VectorView<unsigned_int>.ptr)->_M_p +
             local_a8.super_VectorView<unsigned_int>.buffer_size * 4);
    itr = puVar1 + 1;
    *puVar1 = uVar29;
    local_a8.super_VectorView<unsigned_int>.buffer_size =
         local_a8.super_VectorView<unsigned_int>.buffer_size + 1;
    insert_begin = ops + 4;
LAB_00264fe8:
    SmallVector<unsigned_int,_8UL>::insert(&local_a8,itr,insert_begin,ops + local_100);
    sVar24 = local_a8.super_VectorView<unsigned_int>.buffer_size;
  }
LAB_00264fed:
  local_a8.super_VectorView<unsigned_int>.buffer_size = sVar24;
  pSVar31 = local_f8;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  if ((char)local_124 == '\0') {
    CompilerGLSL::access_chain_abi_cxx11_
              (&local_c8,&this->super_CompilerGLSL,local_114,
               local_a8.super_VectorView<unsigned_int>.ptr,
               (uint32_t)local_a8.super_VectorView<unsigned_int>.buffer_size,local_110,&local_120,
               true);
    pSVar31 = local_f8;
  }
  else {
    uVar43 = (ulong)local_114;
    if ((uVar43 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar43].type == TypeExpression))
    {
      pSVar35 = Variant::get<spirv_cross::SPIRExpression>(pVVar3 + uVar43);
    }
    else {
      pSVar35 = (SPIRExpression *)0x0;
    }
    if ((pSVar35 != (SPIRExpression *)0x0) &&
       ((pSVar35->implied_read_expressions).
        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size == 2)) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,local_114,true);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_a8.super_VectorView<unsigned_int>.ptr;
      CompilerGLSL::access_chain_internal_abi_cxx11_
                (&local_70,&this->super_CompilerGLSL,local_cc,
                 local_a8.super_VectorView<unsigned_int>.ptr,
                 (uint32_t)local_a8.super_VectorView<unsigned_int>.buffer_size,2,&local_120);
      join<std::__cxx11::string,std::__cxx11::string>
                (&local_c8,(spirv_cross *)&local_50,&local_70,ts_1);
      ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      psVar11 = &local_50;
      goto LAB_00265193;
    }
    CompilerGLSL::access_chain_internal_abi_cxx11_
              (&local_c8,&this->super_CompilerGLSL,local_114,
               local_a8.super_VectorView<unsigned_int>.ptr,
               (uint32_t)local_a8.super_VectorView<unsigned_int>.buffer_size,0,&local_120);
  }
  ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_c8);
  psVar11 = &local_c8;
  local_50._M_dataplus._M_p = local_c8._M_dataplus._M_p;
LAB_00265193:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &psVar11->field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pSVar32 = Compiler::get_variable_data_type((Compiler *)this,pSVar31);
  bVar25 = Compiler::has_extended_decoration
                     ((Compiler *)this,ops[2],SPIRVCrossDecorationTessIOOriginalInputTypeID);
  if (bVar25) {
    uVar29 = Compiler::get_extended_decoration
                       ((Compiler *)this,ops[2],SPIRVCrossDecorationTessIOOriginalInputTypeID);
    pSVar32 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + uVar29);
  }
  if (3 < (uint)local_108) {
    uVar43 = 3;
    do {
      bVar25 = Compiler::is_array((Compiler *)this,pSVar32);
      if ((bVar25) || (*(int *)&(pSVar32->super_IVariant).field_0xc != 0xf)) {
        pTVar41 = &pSVar32->parent_type;
      }
      else {
        pSVar33 = Variant::get<spirv_cross::SPIRConstant>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + ops[uVar43]);
        pTVar41 = (pSVar32->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr +
                  (pSVar33->m).c[0].r[0].u32;
      }
      pSVar32 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + pTVar41->id);
      uVar43 = uVar43 + 1;
    } while (local_100 != uVar43);
  }
  bVar25 = Compiler::is_array((Compiler *)this,pSVar32);
  if ((((!bVar25) && (bVar25 = Compiler::is_matrix((Compiler *)this,pSVar32), !bVar25)) &&
      (*(int *)&(pSVar32->super_IVariant).field_0xc != 0xf)) &&
     (local_110->vecsize < pSVar32->vecsize)) {
    CompilerGLSL::vector_swizzle(local_110->vecsize,0);
    ::std::__cxx11::string::append((char *)&local_f0);
  }
  uVar29 = ops[1];
  bVar25 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,ops[2]);
  local_c8._M_dataplus._M_p._0_1_ = bVar25;
  pSVar35 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int_const&,bool>
                      ((Compiler *)this,uVar29,&local_f0,ops,(bool *)&local_c8);
  puVar1 = ops + 1;
  (pSVar35->loaded_from).id = (local_f8->super_IVariant).self.id;
  pSVar35->need_transpose = local_120.need_transpose;
  pSVar35->access_chain = true;
  if (local_120.storage_is_packed == true) {
    Compiler::set_extended_decoration
              ((Compiler *)this,*puVar1,SPIRVCrossDecorationPhysicalTypePacked,0);
  }
  if (local_120.storage_physical_type != 0) {
    Compiler::set_extended_decoration
              ((Compiler *)this,*puVar1,SPIRVCrossDecorationPhysicalTypeID,
               local_120.storage_physical_type);
  }
  if (local_120.storage_is_invariant == true) {
    Compiler::set_decoration((Compiler *)this,(ID)*puVar1,DecorationInvariant,0);
  }
  Compiler::set_extended_decoration
            ((Compiler *)this,*puVar1,SPIRVCrossDecorationTessIOOriginalInputTypeID,
             (pSVar32->super_IVariant).self.id);
  puVar2 = &(this->super_CompilerGLSL).super_Compiler.forwarded_temporaries;
  local_c8._M_dataplus._M_p = (pointer)puVar2;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)puVar2,puVar1);
  local_c8._M_dataplus._M_p =
       (pointer)&(this->super_CompilerGLSL).super_Compiler.suppressed_usage_tracking;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_c8._M_dataplus._M_p,puVar1);
  if (2 < (uint)local_108) {
    uVar43 = 2;
    do {
      Compiler::inherit_expression_dependencies((Compiler *)this,ops[1],ops[uVar43]);
      Compiler::add_implied_read_expression((Compiler *)this,pSVar35,ops[uVar43]);
      uVar43 = uVar43 + 1;
    } while (local_100 != uVar43);
  }
  if ((pSVar35->expression_dependencies).
      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size == 0) {
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&puVar2->_M_h,puVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_a8.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_a8.super_VectorView<unsigned_int>.ptr !=
      &local_a8.stack_storage) {
    free(local_a8.super_VectorView<unsigned_int>.ptr);
  }
  return true;
}

Assistant:

bool CompilerMSL::emit_tessellation_access_chain(const uint32_t *ops, uint32_t length)
{
	// If this is a per-vertex output, remap it to the I/O array buffer.

	// Any object which did not go through IO flattening shenanigans will go there instead.
	// We will unflatten on-demand instead as needed, but not all possible cases can be supported, especially with arrays.

	auto *var = maybe_get_backing_variable(ops[2]);
	bool patch = false;
	bool flat_data = false;
	bool ptr_is_chain = false;
	bool multi_patch = get_execution_model() == ExecutionModelTessellationControl && msl_options.multi_patch_workgroup;

	if (var)
	{
		patch = has_decoration(ops[2], DecorationPatch) || is_patch_block(get_variable_data_type(*var));

		// Should match strip_array in add_interface_block.
		flat_data = var->storage == StorageClassInput ||
		            (var->storage == StorageClassOutput && get_execution_model() == ExecutionModelTessellationControl);

		// We might have a chained access chain, where
		// we first take the access chain to the control point, and then we chain into a member or something similar.
		// In this case, we need to skip gl_in/gl_out remapping.
		ptr_is_chain = var->self != ID(ops[2]);
	}

	BuiltIn bi_type = BuiltIn(get_decoration(ops[2], DecorationBuiltIn));
	if (var && flat_data && !patch &&
	    (!is_builtin_variable(*var) || bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
	     bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance ||
	     get_variable_data_type(*var).basetype == SPIRType::Struct))
	{
		AccessChainMeta meta;
		SmallVector<uint32_t> indices;
		uint32_t next_id = ir.increase_bound_by(1);

		indices.reserve(length - 3 + 1);

		uint32_t first_non_array_index = ptr_is_chain ? 3 : 4;
		VariableID stage_var_id = var->storage == StorageClassInput ? stage_in_ptr_var_id : stage_out_ptr_var_id;
		VariableID ptr = ptr_is_chain ? VariableID(ops[2]) : stage_var_id;
		if (!ptr_is_chain)
		{
			// Index into gl_in/gl_out with first array index.
			indices.push_back(ops[3]);
		}

		auto &result_ptr_type = get<SPIRType>(ops[0]);

		uint32_t const_mbr_id = next_id++;
		uint32_t index = get_extended_decoration(var->self, SPIRVCrossDecorationInterfaceMemberIndex);
		if (var->storage == StorageClassInput || has_decoration(get_variable_element_type(*var).self, DecorationBlock))
		{
			uint32_t i = first_non_array_index;
			auto *type = &get_variable_element_type(*var);
			if (index == uint32_t(-1) && length >= (first_non_array_index + 1))
			{
				// Maybe this is a struct type in the input class, in which case
				// we put it as a decoration on the corresponding member.
				index = get_extended_member_decoration(var->self, get_constant(ops[first_non_array_index]).scalar(),
				                                       SPIRVCrossDecorationInterfaceMemberIndex);
				assert(index != uint32_t(-1));
				i++;
				type = &get<SPIRType>(type->member_types[get_constant(ops[first_non_array_index]).scalar()]);
			}

			// In this case, we're poking into flattened structures and arrays, so now we have to
			// combine the following indices. If we encounter a non-constant index,
			// we're hosed.
			for (; i < length; ++i)
			{
				if ((multi_patch || (!is_array(*type) && !is_matrix(*type))) && type->basetype != SPIRType::Struct)
					break;

				auto *c = maybe_get<SPIRConstant>(ops[i]);
				if (!c || c->specialization)
					SPIRV_CROSS_THROW("Trying to dynamically index into an array interface variable in tessellation. "
					                  "This is currently unsupported.");

				// We're in flattened space, so just increment the member index into IO block.
				// We can only do this once in the current implementation, so either:
				// Struct, Matrix or 1-dimensional array for a control point.
				index += c->scalar();

				if (type->parent_type)
					type = &get<SPIRType>(type->parent_type);
				else if (type->basetype == SPIRType::Struct)
					type = &get<SPIRType>(type->member_types[c->scalar()]);
			}

			if ((!multi_patch && (is_matrix(result_ptr_type) || is_array(result_ptr_type))) ||
			    result_ptr_type.basetype == SPIRType::Struct)
			{
				// We're not going to emit the actual member name, we let any further OpLoad take care of that.
				// Tag the access chain with the member index we're referencing.
				set_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex, index);
			}
			else
			{
				// Access the appropriate member of gl_in/gl_out.
				set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
				indices.push_back(const_mbr_id);

				// Append any straggling access chain indices.
				if (i < length)
					indices.insert(indices.end(), ops + i, ops + length);
			}
		}
		else
		{
			assert(index != uint32_t(-1));
			set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
			indices.push_back(const_mbr_id);

			indices.insert(indices.end(), ops + 4, ops + length);
		}

		// We use the pointer to the base of the input/output array here,
		// so this is always a pointer chain.
		string e;

		if (!ptr_is_chain)
		{
			// This is the start of an access chain, use ptr_chain to index into control point array.
			e = access_chain(ptr, indices.data(), uint32_t(indices.size()), result_ptr_type, &meta, true);
		}
		else
		{
			// If we're accessing a struct, we need to use member indices which are based on the IO block,
			// not actual struct type, so we have to use a split access chain here where
			// first path resolves the control point index, i.e. gl_in[index], and second half deals with
			// looking up flattened member name.

			// However, it is possible that we partially accessed a struct,
			// by taking pointer to member inside the control-point array.
			// For this case, we fall back to a natural access chain since we have already dealt with remapping struct members.
			// One way to check this here is if we have 2 implied read expressions.
			// First one is the gl_in/gl_out struct itself, then an index into that array.
			// If we have traversed further, we use a normal access chain formulation.
			auto *ptr_expr = maybe_get<SPIRExpression>(ptr);
			if (ptr_expr && ptr_expr->implied_read_expressions.size() == 2)
			{
				e = join(to_expression(ptr),
				         access_chain_internal(stage_var_id, indices.data(), uint32_t(indices.size()),
				                               ACCESS_CHAIN_CHAIN_ONLY_BIT, &meta));
			}
			else
			{
				e = access_chain_internal(ptr, indices.data(), uint32_t(indices.size()), 0, &meta);
			}
		}

		// Get the actual type of the object that was accessed. If it's a vector type and we changed it,
		// then we'll need to add a swizzle.
		// For this, we can't necessarily rely on the type of the base expression, because it might be
		// another access chain, and it will therefore already have the "correct" type.
		auto *expr_type = &get_variable_data_type(*var);
		if (has_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID))
			expr_type = &get<SPIRType>(get_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID));
		for (uint32_t i = 3; i < length; i++)
		{
			if (!is_array(*expr_type) && expr_type->basetype == SPIRType::Struct)
				expr_type = &get<SPIRType>(expr_type->member_types[get<SPIRConstant>(ops[i]).scalar()]);
			else
				expr_type = &get<SPIRType>(expr_type->parent_type);
		}
		if (!is_array(*expr_type) && !is_matrix(*expr_type) && expr_type->basetype != SPIRType::Struct &&
		    expr_type->vecsize > result_ptr_type.vecsize)
			e += vector_swizzle(result_ptr_type.vecsize, 0);

		auto &expr = set<SPIRExpression>(ops[1], move(e), ops[0], should_forward(ops[2]));
		expr.loaded_from = var->self;
		expr.need_transpose = meta.need_transpose;
		expr.access_chain = true;

		// Mark the result as being packed if necessary.
		if (meta.storage_is_packed)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypePacked);
		if (meta.storage_physical_type != 0)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypeID, meta.storage_physical_type);
		if (meta.storage_is_invariant)
			set_decoration(ops[1], DecorationInvariant);
		// Save the type we found in case the result is used in another access chain.
		set_extended_decoration(ops[1], SPIRVCrossDecorationTessIOOriginalInputTypeID, expr_type->self);

		// If we have some expression dependencies in our access chain, this access chain is technically a forwarded
		// temporary which could be subject to invalidation.
		// Need to assume we're forwarded while calling inherit_expression_depdendencies.
		forwarded_temporaries.insert(ops[1]);
		// The access chain itself is never forced to a temporary, but its dependencies might.
		suppressed_usage_tracking.insert(ops[1]);

		for (uint32_t i = 2; i < length; i++)
		{
			inherit_expression_dependencies(ops[1], ops[i]);
			add_implied_read_expression(expr, ops[i]);
		}

		// If we have no dependencies after all, i.e., all indices in the access chain are immutable temporaries,
		// we're not forwarded after all.
		if (expr.expression_dependencies.empty())
			forwarded_temporaries.erase(ops[1]);

		return true;
	}

	// If this is the inner tessellation level, and we're tessellating triangles,
	// drop the last index. It isn't an array in this case, so we can't have an
	// array reference here. We need to make this ID a variable instead of an
	// expression so we don't try to dereference it as a variable pointer.
	// Don't do this if the index is a constant 1, though. We need to drop stores
	// to that one.
	auto *m = ir.find_meta(var ? var->self : ID(0));
	if (get_execution_model() == ExecutionModelTessellationControl && var && m &&
	    m->decoration.builtin_type == BuiltInTessLevelInner && get_entry_point().flags.get(ExecutionModeTriangles))
	{
		auto *c = maybe_get<SPIRConstant>(ops[3]);
		if (c && c->scalar() == 1)
			return false;
		auto &dest_var = set<SPIRVariable>(ops[1], *var);
		dest_var.basetype = ops[0];
		ir.meta[ops[1]] = ir.meta[ops[2]];
		inherit_expression_dependencies(ops[1], ops[2]);
		return true;
	}

	return false;
}